

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwGetWindowSize(GLFWwindow *handle,int *width,int *height)

{
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/src/window.c"
                  ,0x21e,"void glfwGetWindowSize(GLFWwindow *, int *, int *)");
  }
  if (width != (int *)0x0) {
    *width = 0;
  }
  if (height != (int *)0x0) {
    *height = 0;
  }
  if (_glfw.initialized != 0) {
    _glfwPlatformGetWindowSize((_GLFWwindow *)handle,width,height);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetWindowSize(GLFWwindow* handle, int* width, int* height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (width)
        *width = 0;
    if (height)
        *height = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowSize(window, width, height);
}